

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_dophase_done(Curl_easy *data,_Bool connected)

{
  IMAP *imap;
  _Bool connected_local;
  Curl_easy *data_local;
  
  if (((data->req).p.imap)->transfer != PPTRANSFER_BODY) {
    Curl_xfer_setup_nop(data);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_dophase_done(struct Curl_easy *data, bool connected)
{
  struct IMAP *imap = data->req.p.imap;

  (void)connected;

  if(imap->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_xfer_setup_nop(data);

  return CURLE_OK;
}